

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

string * nite::strAt(string *__return_storage_ptr__,string *Input,uint x)

{
  char *pcVar1;
  allocator local_19;
  
  if (Input->_M_string_length < (ulong)x) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)Input);
    pcVar1 = (char *)std::__cxx11::string::at((ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,*pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

String nite::strAt(const String &Input, unsigned x){
	if (x>Input.length())
		return "";
	String output = Input;
	output = output.at(x);
	return output;
}